

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_alg_null(uchar **p,uchar *end,mbedtls_asn1_buf *alg)

{
  undefined1 local_48 [8];
  mbedtls_asn1_buf params;
  int ret;
  mbedtls_asn1_buf *alg_local;
  uchar *end_local;
  uchar **p_local;
  
  params.p._4_4_ = 0xffffff92;
  memset(local_48,0,0x18);
  p_local._4_4_ = mbedtls_asn1_get_alg(p,end,alg,(mbedtls_asn1_buf *)local_48);
  if (p_local._4_4_ == 0) {
    if (((local_48._0_4_ == 5) || (local_48._0_4_ == 0)) && (params._0_8_ == 0)) {
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -0x68;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_alg_null( unsigned char **p,
                       const unsigned char *end,
                       mbedtls_asn1_buf *alg )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf params;

    memset( &params, 0, sizeof(mbedtls_asn1_buf) );

    if( ( ret = mbedtls_asn1_get_alg( p, end, alg, &params ) ) != 0 )
        return( ret );

    if( ( params.tag != MBEDTLS_ASN1_NULL && params.tag != 0 ) || params.len != 0 )
        return( MBEDTLS_ERR_ASN1_INVALID_DATA );

    return( 0 );
}